

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsort.c
# Opt level: O2

saidx_t sort_typeBstar(sauchar_t *T,saidx_t *SA,saidx_t *bucket_A,saidx_t *bucket_B,saidx_t n)

{
  saidx_t *ISA;
  uint *puVar1;
  byte bVar2;
  int iVar3;
  bool bVar4;
  saidx_t sVar5;
  long lVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  int *piVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  saidx_t *psVar21;
  byte bVar22;
  int *piVar23;
  sauchar_t *psVar24;
  uint uVar25;
  
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    bucket_A[lVar6] = 0;
  }
  for (lVar6 = 0; lVar6 != 0x10000; lVar6 = lVar6 + 1) {
    bucket_B[lVar6] = 0;
  }
  uVar10 = (ulong)(n - 1);
  uVar11 = uVar10;
  uVar9 = (uint)T[uVar10];
  sVar5 = n;
LAB_0010140f:
  if (-1 < (int)uVar11) {
    uVar8 = -(int)uVar11;
    uVar17 = uVar9;
    do {
      uVar9 = uVar17;
      bucket_A[uVar9] = bucket_A[uVar9] + 1;
      if (uVar11 == 0) {
        uVar11 = 0xffffffff;
        goto LAB_0010140f;
      }
      uVar17 = (uint)T[uVar11 - 1];
      uVar8 = uVar8 + 1;
      uVar11 = uVar11 - 1;
    } while (uVar9 <= uVar17);
    bucket_B[uVar17 << 8 | uVar9] = bucket_B[uVar17 << 8 | uVar9] + 1;
    lVar6 = (long)sVar5;
    sVar5 = sVar5 + -1;
    SA[lVar6 + -1] = -uVar8;
    for (uVar8 = ~uVar8; uVar11 = (ulong)uVar8, -1 < (int)uVar8; uVar8 = uVar8 - 1) {
      bVar22 = T[uVar11];
      uVar9 = (uint)bVar22;
      if (uVar17 < bVar22) goto LAB_0010140f;
      bucket_B[uVar17 << 8 | (uint)bVar22] = bucket_B[uVar17 << 8 | (uint)bVar22] + 1;
      uVar17 = (uint)bVar22;
    }
    uVar11 = 0xffffffff;
    uVar9 = uVar17;
    goto LAB_0010140f;
  }
  psVar21 = bucket_B + 1;
  piVar12 = bucket_B + 0x100;
  iVar20 = 0;
  iVar15 = 0;
  for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
    iVar3 = bucket_A[lVar6];
    bucket_A[lVar6] = iVar15 + iVar20;
    iVar15 = iVar3 + iVar15 + bucket_B[lVar6 * 0x101];
    piVar23 = piVar12;
    for (lVar14 = 1; lVar6 + lVar14 != 0x100; lVar14 = lVar14 + 1) {
      iVar20 = iVar20 + psVar21[lVar14 + -1];
      psVar21[lVar14 + -1] = iVar20;
      iVar15 = iVar15 + *piVar23;
      piVar23 = piVar23 + 0x100;
    }
    psVar21 = psVar21 + 0x101;
    piVar12 = piVar12 + 0x101;
  }
  uVar9 = n - sVar5;
  uVar11 = (ulong)uVar9;
  if (uVar9 != 0 && sVar5 <= n) {
    psVar21 = SA + ((uint)n - uVar11);
    for (uVar17 = uVar9 - 2; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
      uVar7 = *(ushort *)(T + psVar21[uVar17]) << 8 | *(ushort *)(T + psVar21[uVar17]) >> 8;
      iVar15 = bucket_B[uVar7];
      bucket_B[uVar7] = iVar15 + -1;
      SA[(long)iVar15 + -1] = uVar17;
    }
    ISA = SA + uVar11;
    uVar17 = uVar9 - 1;
    uVar16 = (ulong)uVar17;
    uVar7 = *(ushort *)(T + psVar21[uVar16]) << 8 | *(ushort *)(T + psVar21[uVar16]) >> 8;
    iVar15 = bucket_B[uVar7];
    bucket_B[uVar7] = iVar15 + -1;
    SA[(long)iVar15 + -1] = uVar17;
    iVar15 = 0xfe;
    uVar13 = uVar11;
    while (0 < (int)uVar13) {
      for (uVar8 = 0xff; iVar15 < (int)uVar8; uVar8 = uVar8 - 1) {
        uVar25 = bucket_B[(int)(uVar8 | iVar15 << 8)];
        if (1 < (int)((int)uVar13 - uVar25)) {
          sssort(T,psVar21,SA + (int)uVar25,SA + (int)uVar13,ISA,n + uVar9 * -2,2,n,
                 (uint)(SA[(int)uVar25] == uVar17));
        }
        uVar13 = (ulong)uVar25;
      }
      iVar15 = iVar15 + -1;
    }
    for (; -1 < (int)uVar17; uVar17 = uVar17 + (int)lVar6) {
      uVar8 = SA[uVar17];
      if (-1 < (int)uVar8) {
        iVar15 = 0;
        uVar13 = (ulong)uVar17;
        do {
          uVar19 = uVar13;
          ISA[uVar8] = uVar17 + iVar15;
          uVar13 = uVar19 - 1;
          if (uVar19 == 0) {
            *SA = ~uVar17;
            goto LAB_001016c8;
          }
          uVar8 = SA[uVar13];
          iVar15 = iVar15 + -1;
        } while (-1 < (int)uVar8);
        SA[uVar19] = iVar15;
        if (uVar13 == 0) break;
        uVar17 = uVar17 + iVar15;
      }
      puVar1 = (uint *)(SA + (int)uVar17);
      uVar13 = (ulong)*puVar1;
      lVar6 = -1;
      do {
        puVar1[lVar6 + 1] = ~(uint)uVar13;
        ISA[(int)~(uint)uVar13] = uVar17;
        uVar13 = (ulong)(int)puVar1[lVar6];
        lVar6 = lVar6 + -1;
      } while ((long)uVar13 < 0);
      ISA[uVar13] = uVar17;
    }
LAB_001016c8:
    trsort(ISA,SA,uVar9,1);
    bVar22 = T[uVar10];
LAB_001016f2:
    uVar13 = uVar10 & 0xffffffff;
    uVar17 = (uint)uVar10;
    if (-1 < (int)uVar17) {
      uVar19 = 0;
      psVar24 = T;
      do {
        psVar24 = psVar24 + -1;
        uVar10 = 0xffffffffffffffff;
        if (uVar13 == uVar19) goto LAB_001016f2;
        bVar2 = psVar24[uVar13];
        uVar19 = uVar19 + 1;
        bVar4 = bVar22 <= bVar2;
        bVar22 = bVar2;
      } while (bVar4);
      uVar8 = (uint)uVar19;
      iVar15 = 1;
      for (uVar25 = ~uVar8 + uVar17;
          (bVar22 = bVar2, -1 < (int)uVar25 && (bVar22 = T[uVar25], bVar22 <= bVar2));
          uVar25 = uVar25 - 1) {
        iVar15 = iVar15 + 1;
        bVar2 = bVar22;
      }
      iVar20 = ~uVar17 + uVar8;
      if (1 < iVar15) {
        iVar20 = uVar17 - uVar8;
      }
      if (uVar17 == uVar8) {
        iVar20 = uVar17 - uVar8;
      }
      iVar15 = (int)uVar11;
      uVar11 = (ulong)(iVar15 - 1);
      SA[ISA[(long)iVar15 + -1]] = iVar20;
      uVar10 = (ulong)uVar25;
      goto LAB_001016f2;
    }
    bucket_B[0xffff] = n;
    for (uVar17 = 0xfe; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
      iVar15 = bucket_A[(ulong)uVar17 + 1] + -1;
      uVar8 = uVar17 << 8;
      for (uVar25 = 0xff; (int)uVar17 < (int)uVar25; uVar25 = uVar25 - 1) {
        uVar18 = uVar25 << 8 | uVar17;
        iVar20 = bucket_B[(int)uVar18];
        bucket_B[(int)uVar18] = iVar15;
        iVar3 = bucket_B[(int)(uVar25 | uVar8)];
        psVar21 = SA + (iVar15 - iVar20);
        iVar15 = iVar15 - iVar20;
        for (uVar16 = (ulong)(int)uVar16; (long)iVar3 <= (long)uVar16; uVar16 = uVar16 - 1) {
          *psVar21 = SA[uVar16];
          iVar15 = iVar15 + -1;
          psVar21 = psVar21 + -1;
        }
      }
      bucket_B[(int)(uVar17 + 1 | uVar8)] = (iVar15 - bucket_B[(int)(uVar8 | uVar17)]) + 1;
      bucket_B[(int)(uVar8 | uVar17)] = iVar15;
    }
  }
  return uVar9;
}

Assistant:

static
saidx_t
sort_typeBstar(const sauchar_t *T, saidx_t *SA,
               saidx_t *bucket_A, saidx_t *bucket_B,
               saidx_t n) {
  saidx_t *PAb, *ISAb, *buf;
#ifdef _OPENMP
  saidx_t *curbuf;
  saidx_t l;
#endif
  saidx_t i, j, k, t, m, bufsize;
  saint_t c0, c1;
#ifdef _OPENMP
  saint_t d0, d1;
  int tmp;
#endif

  /* Initialize bucket arrays. */
  for(i = 0; i < BUCKET_A_SIZE; ++i) { bucket_A[i] = 0; }
  for(i = 0; i < BUCKET_B_SIZE; ++i) { bucket_B[i] = 0; }

  /* Count the number of occurrences of the first one or two characters of each
     type A, B and B* suffix. Moreover, store the beginning position of all
     type B* suffixes into the array SA. */
  for(i = n - 1, m = n, c0 = T[n - 1]; 0 <= i;) {
    /* type A suffix. */
    do { ++BUCKET_A(c1 = c0); } while((0 <= --i) && ((c0 = T[i]) >= c1));
    if(0 <= i) {
      /* type B* suffix. */
      ++BUCKET_BSTAR(c0, c1);
      SA[--m] = i;
      /* type B suffix. */
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) {
        ++BUCKET_B(c0, c1);
      }
    }
  }
  m = n - m;
/*
note:
  A type B* suffix is lexicographically smaller than a type B suffix that
  begins with the same first two characters.
*/

  /* Calculate the index of start/end point of each bucket. */
  for(c0 = 0, i = 0, j = 0; c0 < ALPHABET_SIZE; ++c0) {
    t = i + BUCKET_A(c0);
    BUCKET_A(c0) = i + j; /* start point */
    i = t + BUCKET_B(c0, c0);
    for(c1 = c0 + 1; c1 < ALPHABET_SIZE; ++c1) {
      j += BUCKET_BSTAR(c0, c1);
      BUCKET_BSTAR(c0, c1) = j; /* end point */
      i += BUCKET_B(c0, c1);
    }
  }

  if(0 < m) {
    /* Sort the type B* suffixes by their first two characters. */
    PAb = SA + n - m; ISAb = SA + m;
    for(i = m - 2; 0 <= i; --i) {
      t = PAb[i], c0 = T[t], c1 = T[t + 1];
      SA[--BUCKET_BSTAR(c0, c1)] = i;
    }
    t = PAb[m - 1], c0 = T[t], c1 = T[t + 1];
    SA[--BUCKET_BSTAR(c0, c1)] = m - 1;

    /* Sort the type B* substrings using sssort. */
#ifdef _OPENMP
    tmp = omp_get_max_threads();
    buf = SA + m, bufsize = (n - (2 * m)) / tmp;
    c0 = ALPHABET_SIZE - 2, c1 = ALPHABET_SIZE - 1, j = m;
#pragma omp parallel default(shared) private(curbuf, k, l, d0, d1, tmp)
    {
      tmp = omp_get_thread_num();
      curbuf = buf + tmp * bufsize;
      k = 0;
      for(;;) {
        #pragma omp critical(sssort_lock)
        {
          if(0 < (l = j)) {
            d0 = c0, d1 = c1;
            do {
              k = BUCKET_BSTAR(d0, d1);
              if(--d1 <= d0) {
                d1 = ALPHABET_SIZE - 1;
                if(--d0 < 0) { break; }
              }
            } while(((l - k) <= 1) && (0 < (l = k)));
            c0 = d0, c1 = d1, j = k;
          }
        }
        if(l == 0) { break; }
        sssort(T, PAb, SA + k, SA + l,
               curbuf, bufsize, 2, n, *(SA + k) == (m - 1));
      }
    }
#else
    buf = SA + m, bufsize = n - (2 * m);
    for(c0 = ALPHABET_SIZE - 2, j = m; 0 < j; --c0) {
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; j = i, --c1) {
        i = BUCKET_BSTAR(c0, c1);
        if(1 < (j - i)) {
          sssort(T, PAb, SA + i, SA + j,
                 buf, bufsize, 2, n, *(SA + i) == (m - 1));
        }
      }
    }
#endif

    /* Compute ranks of type B* substrings. */
    for(i = m - 1; 0 <= i; --i) {
      if(0 <= SA[i]) {
        j = i;
        do { ISAb[SA[i]] = i; } while((0 <= --i) && (0 <= SA[i]));
        SA[i + 1] = i - j;
        if(i <= 0) { break; }
      }
      j = i;
      do { ISAb[SA[i] = ~SA[i]] = j; } while(SA[--i] < 0);
      ISAb[SA[i]] = j;
    }

    /* Construct the inverse suffix array of type B* suffixes using trsort. */
    trsort(ISAb, SA, m, 1);

    /* Set the sorted order of tyoe B* suffixes. */
    for(i = n - 1, j = m, c0 = T[n - 1]; 0 <= i;) {
      for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) >= c1); --i, c1 = c0) { }
      if(0 <= i) {
        t = i;
        for(--i, c1 = c0; (0 <= i) && ((c0 = T[i]) <= c1); --i, c1 = c0) { }
        SA[ISAb[--j]] = ((t == 0) || (1 < (t - i))) ? t : ~t;
      }
    }

    /* Calculate the index of start/end point of each bucket. */
    BUCKET_B(ALPHABET_SIZE - 1, ALPHABET_SIZE - 1) = n; /* end point */
    for(c0 = ALPHABET_SIZE - 2, k = m - 1; 0 <= c0; --c0) {
      i = BUCKET_A(c0 + 1) - 1;
      for(c1 = ALPHABET_SIZE - 1; c0 < c1; --c1) {
        t = i - BUCKET_B(c0, c1);
        BUCKET_B(c0, c1) = i; /* end point */

        /* Move all type B* suffixes to the correct position. */
        for(i = t, j = BUCKET_BSTAR(c0, c1);
            j <= k;
            --i, --k) { SA[i] = SA[k]; }
      }
      BUCKET_BSTAR(c0, c0 + 1) = i - BUCKET_B(c0, c0) + 1; /* start point */
      BUCKET_B(c0, c0) = i; /* end point */
    }
  }

  return m;
}